

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O0

void __thiscall
S2LaxLoopShape::Init
          (S2LaxLoopShape *this,vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices
          )

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  Vector3<double> *__p;
  const_iterator __first;
  const_iterator __last;
  pointer __result;
  Vector3<double> *local_60;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  S2LaxLoopShape *this_local;
  
  sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(vertices);
  *(int *)&(this->super_S2Shape).field_0xc = (int)sVar2;
  uVar3 = (ulong)*(int *)&(this->super_S2Shape).field_0xc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __p = (Vector3<double> *)operator_new__(uVar4);
  if (uVar3 != 0) {
    local_60 = __p;
    do {
      Vector3<double>::Vector3(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __p + uVar3);
  }
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  reset<Vector3<double>*,void>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_,__p);
  __first = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::begin(vertices);
  __last = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(vertices);
  __result = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::get
                       (&this->vertices_);
  std::
  copy<__gnu_cxx::__normal_iterator<Vector3<double>const*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,Vector3<double>*>
            ((__normal_iterator<const_Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
              )__first._M_current,
             (__normal_iterator<const_Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
              )__last._M_current,__result);
  return;
}

Assistant:

void S2LaxLoopShape::Init(const vector<S2Point>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  std::copy(vertices.begin(), vertices.end(), vertices_.get());
}